

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

bool __thiscall CLI::App::_parse_single_config(App *this,ConfigItem *item,size_t level)

{
  string *__lhs;
  element_type *peVar1;
  bool bVar2;
  const_reference pvVar3;
  App *this_00;
  Option *this_01;
  ConfigError *__return_storage_ptr__;
  string res;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (level < (ulong)((long)(item->parents).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(item->parents).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(&item->parents,level);
    ::std::__cxx11::string::string((string *)&local_b0,(string *)pvVar3);
    this_00 = get_subcommand(this,&local_b0);
    ::std::__cxx11::string::~string((string *)&local_b0);
    bVar2 = _parse_single_config(this_00,item,level + 1);
  }
  else {
    __lhs = &item->name;
    bVar2 = ::std::operator==(__lhs,"++");
    if (bVar2) {
      bVar2 = true;
      if (this->configurable_ == true) {
        increment_parsed(this);
        _trigger_pre_parse(this,2);
        if (this->parent_ != (App *)0x0) {
          res._M_dataplus._M_p = (pointer)this;
          ::std::vector<CLI::App*,std::allocator<CLI::App*>>::emplace_back<CLI::App*>
                    ((vector<CLI::App*,std::allocator<CLI::App*>> *)
                     &this->parent_->parsed_subcommands_,(App **)&res);
        }
      }
    }
    else {
      bVar2 = ::std::operator==(__lhs,"--");
      if (bVar2) {
        bVar2 = true;
        if (this->configurable_ == true) {
          _process_callbacks(this);
          _process_requirements(this);
          run_callback(this,false);
        }
      }
      else {
        ::std::operator+(&local_50,"--",__lhs);
        this_01 = get_option_no_throw(this,&local_50);
        ::std::__cxx11::string::~string((string *)&local_50);
        if (this_01 == (Option *)0x0) {
          if (this->allow_config_extras_ == capture) {
            local_90._M_dataplus._M_p._0_4_ = 0;
            ConfigItem::fullname_abi_cxx11_(&res,item);
            ::std::
            vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
            ::emplace_back<CLI::detail::Classifier,std::__cxx11::string>
                      ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                        *)&this->missing_,(Classifier *)&local_90,&res);
            ::std::__cxx11::string::~string((string *)&res);
          }
          bVar2 = false;
        }
        else {
          if ((this_01->super_OptionBase<CLI::Option>).configurable_ == false) {
            __return_storage_ptr__ = (ConfigError *)__cxa_allocate_exception(0x38);
            ConfigItem::fullname_abi_cxx11_(&local_70,item);
            ConfigError::NotConfigurable(__return_storage_ptr__,&local_70);
            __cxa_throw(__return_storage_ptr__,&ConfigError::typeinfo,Error::~Error);
          }
          bVar2 = true;
          if ((this_01->results_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (this_01->results_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            if (this_01->expected_min_ == 0) {
              peVar1 = (this->config_formatter_).
                       super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              (*peVar1->_vptr_Config[2])(&res,peVar1,item);
              ::std::__cxx11::string::string((string *)&local_d0,(string *)&res);
              Option::get_flag_value(&local_90,this_01,__lhs,&local_d0);
              ::std::__cxx11::string::operator=((string *)&res,(string *)&local_90);
              ::std::__cxx11::string::~string((string *)&local_90);
              ::std::__cxx11::string::~string((string *)&local_d0);
              ::std::__cxx11::string::string((string *)&local_f0,(string *)&res);
              Option::add_result(this_01,&local_f0);
              ::std::__cxx11::string::~string((string *)&local_f0);
              ::std::__cxx11::string::~string((string *)&res);
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_108,&item->inputs);
              Option::add_result(this_01,&local_108);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_108);
              Option::run_callback(this_01);
            }
          }
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool _parse_single_config(const ConfigItem &item, std::size_t level = 0) {
        if(level < item.parents.size()) {
            try {
                auto subcom = get_subcommand(item.parents.at(level));
                auto result = subcom->_parse_single_config(item, level + 1);

                return result;
            } catch(const OptionNotFound &) {
                return false;
            }
        }
        // check for section open
        if(item.name == "++") {
            if(configurable_) {
                increment_parsed();
                _trigger_pre_parse(2);
                if(parent_ != nullptr) {
                    parent_->parsed_subcommands_.push_back(this);
                }
            }
            return true;
        }
        // check for section close
        if(item.name == "--") {
            if(configurable_) {
                _process_callbacks();
                _process_requirements();
                run_callback();
            }
            return true;
        }
        Option *op = get_option_no_throw("--" + item.name);
        if(op == nullptr) {
            // If the option was not present
            if(get_allow_config_extras() == config_extras_mode::capture)
                // Should we worry about classifying the extras properly?
                missing_.emplace_back(detail::Classifier::NONE, item.fullname());
            return false;
        }

        if(!op->get_configurable())
            throw ConfigError::NotConfigurable(item.fullname());

        if(op->empty()) {
            // Flag parsing
            if(op->get_expected_min() == 0) {
                auto res = config_formatter_->to_flag(item);
                res = op->get_flag_value(item.name, res);

                op->add_result(res);

            } else {
                op->add_result(item.inputs);
                op->run_callback();
            }
        }

        return true;
    }